

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * flatbuffers::RemoveStringQuotes(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  char ch;
  string *s_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cVar1 = *pcVar2;
  uVar3 = std::__cxx11::string::size();
  if ((1 < uVar3) &&
     (((cVar1 == '\"' || (cVar1 == '\'')) &&
      (pcVar2 = (char *)std::__cxx11::string::back(), cVar1 == *pcVar2)))) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

std::string RemoveStringQuotes(const std::string &s) {
  auto ch = *s.c_str();
  return ((s.size() >= 2) && (ch == '\"' || ch == '\'') && (ch == s.back()))
             ? s.substr(1, s.length() - 2)
             : s;
}